

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O3

void __thiscall
Dashel::SocketServerStream::SocketServerStream(SocketServerStream *this,string *targetName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int *p_Var2;
  int iVar3;
  string *name;
  DashelException *pDVar4;
  int *piVar5;
  IPV4Address bindAddress;
  socklen_t sizeof_addr;
  int flag;
  sockaddr_in addr;
  ostringstream portnum;
  IPV4Address local_1d8;
  socklen_t local_1d0 [2];
  long *local_1c8;
  long local_1b8 [2];
  sockaddr local_1a8;
  string local_198 [3];
  ios_base local_128 [264];
  
  paVar1 = &local_198[0].field_2;
  local_198[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"tcpin","");
  Stream::Stream((Stream *)&(this->super_SelectableStream).field_0x10,local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  local_198[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"tcpin","");
  (this->super_SelectableStream)._vptr_SelectableStream = (_func_int **)0x122370;
  *(undefined8 *)&(this->super_SelectableStream).field_0x10 = 0x1223c0;
  (this->super_SelectableStream).fd = -1;
  (this->super_SelectableStream).writeOnly = false;
  (this->super_SelectableStream).pollEvent = 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  (this->super_SelectableStream)._vptr_SelectableStream =
       (_func_int **)&PTR__SocketServerStream_001222a8;
  *(undefined ***)&(this->super_SelectableStream).field_0x10 = &PTR__SocketServerStream_00122310;
  ParameterSet::add((ParameterSet *)&(this->super_SelectableStream).field_0x40,
                    "tcpin:port=5000;address=0.0.0.0");
  ParameterSet::add((ParameterSet *)
                    (&(this->super_SelectableStream).field_0x30 +
                    (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]),
                    (targetName->_M_dataplus)._M_p);
  name = ParameterSet::get_abi_cxx11_
                   ((ParameterSet *)
                    (&(this->super_SelectableStream).field_0x30 +
                    (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]),"address");
  iVar3 = ParameterSet::get<int>
                    ((ParameterSet *)
                     (&(this->super_SelectableStream).field_0x30 +
                     (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]),"port");
  IPV4Address::IPV4Address(&local_1d8,name,(unsigned_short)iVar3);
  iVar3 = socket(2,1,6);
  (this->super_SelectableStream).fd = iVar3;
  if (iVar3 < 0) {
    pDVar4 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar5 = __errno_location();
    DashelException::DashelException
              (pDVar4,ConnectionFailed,*piVar5,"Cannot create socket.",(Stream *)0x0);
    __cxa_throw(pDVar4,&DashelException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1d0[1] = 1;
  iVar3 = setsockopt(iVar3,1,2,local_1d0 + 1,4);
  if (iVar3 < 0) {
    pDVar4 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar5 = __errno_location();
    DashelException::DashelException
              (pDVar4,ConnectionFailed,*piVar5,
               "Cannot set address reuse flag on socket, probably the port is already in use.",
               (Stream *)0x0);
    __cxa_throw(pDVar4,&DashelException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1a8.sa_family = 2;
  local_1a8.sa_data._0_2_ = local_1d8.port << 8 | local_1d8.port >> 8;
  local_1a8.sa_data._2_4_ =
       local_1d8.address >> 0x18 | (local_1d8.address & 0xff0000) >> 8 |
       (local_1d8.address & 0xff00) << 8 | local_1d8.address << 0x18;
  iVar3 = bind((this->super_SelectableStream).fd,&local_1a8,0x10);
  if (iVar3 == 0) {
    if (local_1d8.port == 0) {
      local_1d0[0] = 0x10;
      iVar3 = getsockname((this->super_SelectableStream).fd,&local_1a8,local_1d0);
      if (iVar3 != 0) {
        pDVar4 = (DashelException *)__cxa_allocate_exception(0x20);
        piVar5 = __errno_location();
        DashelException::DashelException
                  (pDVar4,ConnectionFailed,*piVar5,"Cannot retrieve socket port assignment.",
                   (Stream *)0x0);
        __cxa_throw(pDVar4,&DashelException::typeinfo,std::runtime_error::~runtime_error);
      }
      ParameterSet::erase((ParameterSet *)
                          (&(this->super_SelectableStream).field_0x30 +
                          (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]),"port");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::ostream::_M_insert<unsigned_long>((ulong)local_198);
      p_Var2 = (this->super_SelectableStream)._vptr_SelectableStream[-3];
      std::__cxx11::stringbuf::str();
      ParameterSet::addParam
                ((ParameterSet *)(&(this->super_SelectableStream).field_0x30 + (long)p_Var2),"port",
                 (char *)local_1c8,true);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base(local_128);
    }
    iVar3 = listen((this->super_SelectableStream).fd,0x10);
    if (-1 < iVar3) {
      return;
    }
    pDVar4 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar5 = __errno_location();
    DashelException::DashelException
              (pDVar4,ConnectionFailed,*piVar5,"Cannot listen on socket.",(Stream *)0x0);
  }
  else {
    pDVar4 = (DashelException *)__cxa_allocate_exception(0x20);
    piVar5 = __errno_location();
    DashelException::DashelException
              (pDVar4,ConnectionFailed,*piVar5,
               "Cannot bind socket to port, probably the port is already in use.",(Stream *)0x0);
  }
  __cxa_throw(pDVar4,&DashelException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

explicit SocketServerStream(const std::string& targetName) :
			Stream("tcpin"),
			SelectableStream("tcpin")
		{
			target.add("tcpin:port=5000;address=0.0.0.0");
			target.add(targetName.c_str());

			IPV4Address bindAddress(target.get("address"), target.get<int>("port"));

			// create socket
			fd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
			if (fd < 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot create socket.");

			// reuse address
			int flag = 1;
			if (setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &flag, sizeof(flag)) < 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot set address reuse flag on socket, probably the port is already in use.");

			// bind
			sockaddr_in addr;
			addr.sin_family = AF_INET;
			addr.sin_port = htons(bindAddress.port);
			addr.sin_addr.s_addr = htonl(bindAddress.address);
			if (::bind(fd, (struct sockaddr*)&addr, sizeof(addr)) != 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot bind socket to port, probably the port is already in use.");

			// retrieve port number, if a dynamic one was requested
			if (bindAddress.port == 0)
			{
				socklen_t sizeof_addr(sizeof(addr));
				if (::getsockname(fd, (struct sockaddr*)&addr, &sizeof_addr) != 0)
					throw DashelException(DashelException::ConnectionFailed, errno, "Cannot retrieve socket port assignment.");
				target.erase("port");
				ostringstream portnum;
				portnum << ntohs(addr.sin_port);
				target.addParam("port", portnum.str().c_str(), true);
			}

			// Listen on socket, backlog is sort of arbitrary.
			if (listen(fd, 16) < 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot listen on socket.");
		}